

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

void examine_app0(j_decompress_ptr cinfo,JOCTET *data,uint datalen,INT32 remaining)

{
  JOCTET JVar1;
  jpeg_error_mgr *pjVar2;
  long lVar3;
  int iVar4;
  int *_mp;
  INT32 totallen;
  INT32 remaining_local;
  uint datalen_local;
  JOCTET *data_local;
  j_decompress_ptr cinfo_local;
  
  if ((((datalen < 0xe) || (*data != 'J')) || (data[1] != 'F')) ||
     (((data[2] != 'I' || (data[3] != 'F')) || (data[4] != '\0')))) {
    iVar4 = (int)((ulong)datalen + remaining);
    if (((datalen < 6) || (*data != 'J')) ||
       ((data[1] != 'F' || (((data[2] != 'X' || (data[3] != 'X')) || (data[4] != '\0')))))) {
      cinfo->err->msg_code = 0x4f;
      (cinfo->err->msg_parm).i[0] = iVar4;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    else {
      JVar1 = data[5];
      if (JVar1 == '\x10') {
        cinfo->err->msg_code = 0x6e;
        (cinfo->err->msg_parm).i[0] = iVar4;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
      else if (JVar1 == '\x11') {
        cinfo->err->msg_code = 0x6f;
        (cinfo->err->msg_parm).i[0] = iVar4;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
      else if (JVar1 == '\x13') {
        cinfo->err->msg_code = 0x70;
        (cinfo->err->msg_parm).i[0] = iVar4;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
      else {
        cinfo->err->msg_code = 0x5b;
        *(uint *)&cinfo->err->msg_parm = (uint)data[5];
        (cinfo->err->msg_parm).i[1] = iVar4;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      }
    }
  }
  else {
    cinfo->saw_JFIF_marker = 1;
    cinfo->JFIF_major_version = data[5];
    cinfo->JFIF_minor_version = data[6];
    cinfo->density_unit = data[7];
    cinfo->X_density = (ushort)data[8] * 0x100 + (ushort)data[9];
    cinfo->Y_density = (ushort)data[10] * 0x100 + (ushort)data[0xb];
    if (cinfo->JFIF_major_version != '\x01') {
      cinfo->err->msg_code = 0x7a;
      *(uint *)&cinfo->err->msg_parm = (uint)cinfo->JFIF_major_version;
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
    }
    pjVar2 = cinfo->err;
    *(uint *)&pjVar2->msg_parm = (uint)cinfo->JFIF_major_version;
    *(uint *)((long)&pjVar2->msg_parm + 4) = (uint)cinfo->JFIF_minor_version;
    *(uint *)((long)&pjVar2->msg_parm + 8) = (uint)cinfo->X_density;
    *(uint *)((long)&pjVar2->msg_parm + 0xc) = (uint)cinfo->Y_density;
    *(uint *)((long)&pjVar2->msg_parm + 0x10) = (uint)cinfo->density_unit;
    cinfo->err->msg_code = 0x59;
    (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    if (data[0xc] != '\0' || data[0xd] != '\0') {
      cinfo->err->msg_code = 0x5c;
      *(uint *)&cinfo->err->msg_parm = (uint)data[0xc];
      *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)data[0xd];
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    lVar3 = (ulong)datalen + remaining + -0xe;
    if (lVar3 != (ulong)data[0xc] * (ulong)data[0xd] * 3) {
      cinfo->err->msg_code = 0x5a;
      (cinfo->err->msg_parm).i[0] = (int)lVar3;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
  }
  return;
}

Assistant:

LOCAL(void)
examine_app0 (j_decompress_ptr cinfo, JOCTET FAR * data,
	      unsigned int datalen, INT32 remaining)
/* Examine first few bytes from an APP0.
 * Take appropriate action if it is a JFIF marker.
 * datalen is # of bytes at data[], remaining is length of rest of marker data.
 */
{
  INT32 totallen = (INT32) datalen + remaining;

  if (datalen >= APP0_DATA_LEN &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x49 &&
      GETJOCTET(data[3]) == 0x46 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF APP0 marker: save info */
    cinfo->saw_JFIF_marker = TRUE;
    cinfo->JFIF_major_version = GETJOCTET(data[5]);
    cinfo->JFIF_minor_version = GETJOCTET(data[6]);
    cinfo->density_unit = GETJOCTET(data[7]);
    cinfo->X_density = (GETJOCTET(data[8]) << 8) + GETJOCTET(data[9]);
    cinfo->Y_density = (GETJOCTET(data[10]) << 8) + GETJOCTET(data[11]);
    /* Check version.
     * Major version must be 1, anything else signals an incompatible change.
     * (We used to treat this as an error, but now it's a nonfatal warning,
     * because some bozo at Hijaak couldn't read the spec.)
     * Minor version should be 0..2, but process anyway if newer.
     */
    if (cinfo->JFIF_major_version != 1)
      WARNMS2(cinfo, JWRN_JFIF_MAJOR,
	      cinfo->JFIF_major_version, cinfo->JFIF_minor_version);
    /* Generate trace messages */
    TRACEMS5(cinfo, 1, JTRC_JFIF,
	     cinfo->JFIF_major_version, cinfo->JFIF_minor_version,
	     cinfo->X_density, cinfo->Y_density, cinfo->density_unit);
    /* Validate thumbnail dimensions and issue appropriate messages */
    if (GETJOCTET(data[12]) | GETJOCTET(data[13]))
      TRACEMS2(cinfo, 1, JTRC_JFIF_THUMBNAIL,
	       GETJOCTET(data[12]), GETJOCTET(data[13]));
    totallen -= APP0_DATA_LEN;
    if (totallen !=
	((INT32)GETJOCTET(data[12]) * (INT32)GETJOCTET(data[13]) * (INT32) 3))
      TRACEMS1(cinfo, 1, JTRC_JFIF_BADTHUMBNAILSIZE, (int) totallen);
  } else if (datalen >= 6 &&
      GETJOCTET(data[0]) == 0x4A &&
      GETJOCTET(data[1]) == 0x46 &&
      GETJOCTET(data[2]) == 0x58 &&
      GETJOCTET(data[3]) == 0x58 &&
      GETJOCTET(data[4]) == 0) {
    /* Found JFIF "JFXX" extension APP0 marker */
    /* The library doesn't actually do anything with these,
     * but we try to produce a helpful trace message.
     */
    switch (GETJOCTET(data[5])) {
    case 0x10:
      TRACEMS1(cinfo, 1, JTRC_THUMB_JPEG, (int) totallen);
      break;
    case 0x11:
      TRACEMS1(cinfo, 1, JTRC_THUMB_PALETTE, (int) totallen);
      break;
    case 0x13:
      TRACEMS1(cinfo, 1, JTRC_THUMB_RGB, (int) totallen);
      break;
    default:
      TRACEMS2(cinfo, 1, JTRC_JFIF_EXTENSION,
	       GETJOCTET(data[5]), (int) totallen);
      break;
    }
  } else {
    /* Start of APP0 does not match "JFIF" or "JFXX", or too short */
    TRACEMS1(cinfo, 1, JTRC_APP0, (int) totallen);
  }
}